

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

int __thiscall
FPathTraverse::PortalRelocate(FPathTraverse *this,intercept_t *in,int flags,DVector3 *optpos)

{
  uint uVar1;
  line_t *plVar2;
  int iVar3;
  FLinePortal *pFVar4;
  double endx;
  double endy;
  double hity;
  double hitx;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  iVar3 = 0;
  if (in->isaline == true) {
    plVar2 = (in->d).line;
    if ((plVar2->portalindex < linePortals.Count) &&
       (iVar3 = 0, (linePortals.Array[plVar2->portalindex].mFlags & 2) != 0)) {
      local_40 = (this->trace).y;
      local_38 = (this->trace).x;
      if ((plVar2->delta).Y * ((plVar2->v1->p).X - local_38) +
          (plVar2->delta).X * (local_40 - (plVar2->v1->p).Y) <= 1.52587890625e-05) {
        local_50 = local_38 + (this->trace).dx;
        local_48 = local_40 + (this->trace).dy;
        P_TranslatePortalXY(plVar2,&local_38,&local_40);
        P_TranslatePortalXY((in->d).line,&local_50,&local_48);
        if (optpos != (DVector3 *)0x0) {
          P_TranslatePortalXY((in->d).line,&optpos->X,&optpos->Y);
          P_TranslatePortalZ((in->d).line,&optpos->Z);
        }
        plVar2 = (in->d).line;
        uVar1 = this->intercept_index;
        if (intercepts.Count <= uVar1 && uVar1 - intercepts.Count != 0) {
          TArray<intercept_t,_intercept_t>::Grow(&intercepts,uVar1 - intercepts.Count);
        }
        intercepts.Count = uVar1;
        init(this,(EVP_PKEY_CTX *)(ulong)(uint)flags);
        uVar1 = plVar2->portalindex;
        pFVar4 = (FLinePortal *)0x0;
        if (uVar1 < linePortals.Count) {
          pFVar4 = linePortals.Array + uVar1;
        }
        iVar3 = (uint)(pFVar4->mType == '\x03') * 2 + -1;
      }
    }
  }
  return iVar3;
}

Assistant:

int FPathTraverse::PortalRelocate(intercept_t *in, int flags, DVector3 *optpos)
{
	if (!in->isaline || !in->d.line->isLinePortal()) return false;
	if (P_PointOnLineSidePrecise(trace.x, trace.y, in->d.line) == 1) return false;

	double hitx = trace.x;
	double hity = trace.y;
	double endx = trace.x + trace.dx;
	double endy = trace.y + trace.dy;
	
	P_TranslatePortalXY(in->d.line, hitx, hity);
	P_TranslatePortalXY(in->d.line, endx, endy);
	if (optpos != NULL)
	{
		P_TranslatePortalXY(in->d.line, optpos->X, optpos->Y);
		P_TranslatePortalZ(in->d.line, optpos->Z);
	}
	line_t *saved = in->d.line;	// this gets overwritten by the init call.
	intercepts.Resize(intercept_index);
	init(hitx, hity, endx, endy, flags, in->frac + EQUAL_EPSILON);
	return saved->getPortal()->mType == PORTT_LINKED? 1:-1;
}